

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

void __thiscall
vkt::anon_unknown_0::PixelValue::PixelValue
          (PixelValue *this,Maybe<bool> *x,Maybe<bool> *y,Maybe<bool> *z,Maybe<bool> *w)

{
  byte bVar1;
  long lVar2;
  size_t ndx;
  size_t ndx_00;
  Maybe<bool> values [4];
  
  this->m_status = 0;
  values[0].m_ptr = (bool *)0x0;
  if (x->m_ptr != (bool *)0x0) {
    values[0].field_1.m_data[0] = *x->m_ptr;
    values[0].m_ptr = (bool *)values[0].field_1.m_data;
  }
  values[1].m_ptr = (bool *)0x0;
  if (y->m_ptr != (bool *)0x0) {
    values[1].field_1.m_data[0] = *y->m_ptr;
    values[1].m_ptr = (bool *)values[1].field_1.m_data;
  }
  values[2].m_ptr = (bool *)0x0;
  if (z->m_ptr != (bool *)0x0) {
    values[2].field_1.m_data[0] = *z->m_ptr;
    values[2].m_ptr = (bool *)values[2].field_1.m_data;
  }
  values[3].m_ptr = (bool *)0x0;
  if (w->m_ptr != (bool *)0x0) {
    values[3].field_1.m_data[0] = *w->m_ptr;
    values[3].m_ptr = (bool *)values[3].field_1.m_data;
  }
  lVar2 = 0;
  for (ndx_00 = 0; ndx_00 != 4; ndx_00 = ndx_00 + 1) {
    if ((&values[0].m_ptr)[lVar2] == (bool *)0x0) {
      bVar1 = (byte)lVar2 & 0x1f;
      this->m_status =
           this->m_status & ((ushort)(-2 << bVar1) | (ushort)(0xfffffffe >> 0x20 - bVar1));
    }
    else {
      setValue(this,ndx_00,*(&values[0].m_ptr)[lVar2]);
    }
    lVar2 = lVar2 + 2;
  }
  return;
}

Assistant:

PixelValue::PixelValue (const Maybe<bool>&	x,
						const Maybe<bool>&	y,
						const Maybe<bool>&	z,
						const Maybe<bool>&	w)
	: m_status (0)
{
	const Maybe<bool> values[] =
	{
		x, y, z, w
	};

	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(values); ndx++)
	{
		if (values[ndx])
			setValue(ndx, *values[ndx]);
		else
			setUndefined(ndx);
	}

	DE_ASSERT(m_status <= 0xFFu);
}